

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

Maybe<const_capnp::StructSchema::Field_&> __thiscall
kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::find<capnp::Text::Reader>
          (HashMap<kj::StringPtr,_capnp::StructSchema::Field> *this,Reader *key)

{
  Maybe<const_capnp::StructSchema::Field_&> MVar1;
  Entry *pEVar2;
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> local_20 [8];
  long local_18;
  
  pEVar2 = (this->table).rows.builder.ptr;
  table.size_ = (size_t)pEVar2;
  table.ptr = (Entry *)&(this->table).indexes;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
  find<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry_const,capnp::Text::Reader&>
            (local_20,table,
             (Reader *)
             (((long)(this->table).rows.builder.pos - (long)pEVar2 >> 4) * -0x3333333333333333));
  pEVar2 = (Entry *)0x0;
  if (local_20[0] !=
      (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x0) {
    pEVar2 = (this->table).rows.builder.ptr + local_18;
  }
  MVar1.ptr = &pEVar2->value;
  if (pEVar2 == (Entry *)0x0) {
    MVar1.ptr = (Field *)0x0;
  }
  return (Maybe<const_capnp::StructSchema::Field_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<const Value&> HashMap<Key, Value>::find(KeyLike&& key) const {
  return table.find(key).map([](const Entry& e) -> const Value& { return e.value; });
}